

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O2

size_t ascii2dw(uint8_t *string)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  sVar1 = strlen((char *)string);
  uVar3 = 0;
  uVar2 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar3 == uVar2) {
      return uVar2 & 0xff;
    }
    for (lVar4 = 0; lVar4 != 0x61; lVar4 = lVar4 + 1) {
      if ((uint)string[uVar3] ==
          (int)"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ[]\'*>_:=_.,-_?!;)(``/\'___________ \n"
               [lVar4]) {
        string[uVar3] = (uint8_t)lVar4;
        break;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

size_t ascii2dw(uint8_t *string)
{
    uint8_t i, j;
    int len, alphalen;

    len = strlen((char*)string);
    alphalen = strlen(alphabet);
    for (i=0; i < len; i++) {
        for (j=0; j < alphalen; j++) {
            if (string[i] == alphabet[j]) {
                string[i] = j;
                break;
            }
        }
    }
    return i;
}